

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lc.cpp
# Opt level: O1

bool __thiscall libDAI::LC::initProps(LC *this)

{
  Properties *this_00;
  _Base_ptr p_Var1;
  pointer pcVar2;
  bool bVar3;
  UpdateType UVar4;
  CavityType CVar5;
  const_iterator cVar6;
  unsigned_long uVar7;
  double dVar8;
  undefined1 local_80 [32];
  _Base_ptr p_Stack_60;
  size_t local_58;
  PropertyKey local_50;
  
  pcVar2 = local_80 + 0x10;
  local_80._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"updates","");
  this_00 = &(this->super_DAIAlgFG).super_InferenceAlgorithm._properties;
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                  *)this_00,(key_type *)local_80);
  p_Var1 = &(this->super_DAIAlgFG).super_InferenceAlgorithm._properties.
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
            ._M_t._M_impl.super__Rb_tree_header._M_header;
  if ((pointer)local_80._0_8_ != pcVar2) {
    operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
  }
  if (cVar6._M_node != p_Var1) {
    local_80._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"cavity","");
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                    *)this_00,(key_type *)local_80);
    if ((pointer)local_80._0_8_ != pcVar2) {
      operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
    }
    if (cVar6._M_node != p_Var1) {
      local_80._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"tol","");
      cVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                      *)this_00,(key_type *)local_80);
      if ((pointer)local_80._0_8_ != pcVar2) {
        operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
      }
      if (cVar6._M_node != p_Var1) {
        local_80._0_8_ = pcVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"maxiter","");
        cVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                        *)this_00,(key_type *)local_80);
        if ((pointer)local_80._0_8_ != pcVar2) {
          operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
        }
        if (cVar6._M_node != p_Var1) {
          local_80._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"verbose","");
          cVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                          *)this_00,(key_type *)local_80);
          if ((pointer)local_80._0_8_ != pcVar2) {
            operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
          }
          if (cVar6._M_node != p_Var1) {
            local_80._0_8_ = pcVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"updates","");
            UVar4 = Properties::FromStringTo<libDAI::LC::UpdateType>
                              (this_00,(PropertyKey *)local_80);
            (this->Props).updates.v = UVar4.v;
            if ((pointer)local_80._0_8_ != pcVar2) {
              operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
            }
            local_80._0_8_ = pcVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"cavity","");
            CVar5 = Properties::FromStringTo<libDAI::LC::CavityType>
                              (this_00,(PropertyKey *)local_80);
            (this->Props).cavity.v = CVar5.v;
            if ((pointer)local_80._0_8_ != pcVar2) {
              operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
            }
            local_80._0_8_ = pcVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"reinit","");
            cVar6 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                            *)this_00,(key_type *)local_80);
            if ((pointer)local_80._0_8_ != pcVar2) {
              operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
            }
            if (cVar6._M_node == p_Var1) {
              (this->Props).reinit = true;
            }
            else {
              local_80._0_8_ = pcVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"reinit","");
              bVar3 = Properties::FromStringTo<bool>(this_00,(PropertyKey *)local_80);
              (this->Props).reinit = bVar3;
              if ((pointer)local_80._0_8_ != pcVar2) {
                operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
              }
            }
            local_80._0_8_ = pcVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"tol","");
            dVar8 = Properties::FromStringTo<double>(this_00,(PropertyKey *)local_80);
            (this->Props).tol = dVar8;
            if ((pointer)local_80._0_8_ != pcVar2) {
              operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
            }
            local_80._0_8_ = pcVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"maxiter","");
            uVar7 = Properties::FromStringTo<unsigned_long>(this_00,(PropertyKey *)local_80);
            (this->Props).maxiter = uVar7;
            if ((pointer)local_80._0_8_ != pcVar2) {
              operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
            }
            local_80._0_8_ = pcVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"verbose","");
            uVar7 = Properties::FromStringTo<unsigned_long>(this_00,(PropertyKey *)local_80);
            (this->Props).verbose = uVar7;
            if ((pointer)local_80._0_8_ != pcVar2) {
              operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
            }
            local_80._0_8_ = pcVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"damping","");
            cVar6 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                            *)this_00,(key_type *)local_80);
            if ((pointer)local_80._0_8_ != pcVar2) {
              operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
            }
            if (cVar6._M_node == p_Var1) {
              (this->Props).damping = 0.0;
            }
            else {
              local_80._0_8_ = pcVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"damping","");
              dVar8 = Properties::FromStringTo<double>(this_00,(PropertyKey *)local_80);
              (this->Props).damping = dVar8;
              if ((pointer)local_80._0_8_ != pcVar2) {
                operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
              }
            }
            local_80._0_8_ = pcVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"cavainame","");
            cVar6 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                            *)this_00,(key_type *)local_80);
            if ((pointer)local_80._0_8_ != pcVar2) {
              operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
            }
            if (cVar6._M_node != p_Var1) {
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"cavainame","");
              Properties::GetAs<std::__cxx11::string>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_80,this_00,&local_50);
              std::__cxx11::string::operator=((string *)&(this->Props).cavainame,(string *)local_80)
              ;
              if ((pointer)local_80._0_8_ != pcVar2) {
                operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
            }
            local_80._0_8_ = pcVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"cavaiopts","");
            cVar6 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                            *)this_00,(key_type *)local_80);
            if ((pointer)local_80._0_8_ != pcVar2) {
              operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
            }
            if (cVar6._M_node == p_Var1) {
              return true;
            }
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"cavaiopts","");
            Properties::FromStringTo<libDAI::Properties>((Properties *)local_80,this_00,&local_50);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
            ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                     *)&(this->Props).cavaiopts);
            if ((_Base_ptr)local_80._16_8_ != (_Base_ptr)0x0) {
              (this->Props).cavaiopts.
              super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
              ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = local_80._8_4_;
              *(undefined8 *)
               ((long)&(this->Props).cavaiopts.
                       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                       ._M_t._M_impl.super__Rb_tree_header._M_header + 8) = local_80._16_8_;
              *(undefined8 *)
               ((long)&(this->Props).cavaiopts.
                       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                       ._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) = local_80._24_8_;
              *(_Base_ptr *)
               ((long)&(this->Props).cavaiopts.
                       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                       ._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) = p_Stack_60;
              *(_Rb_tree_header **)(local_80._16_8_ + 8) =
                   &(this->Props).cavaiopts.
                    super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                    ._M_t._M_impl.super__Rb_tree_header;
              (this->Props).cavaiopts.
              super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
              ._M_t._M_impl.super__Rb_tree_header._M_node_count = local_58;
              local_80._16_8_ = (_Base_ptr)0x0;
              local_58 = 0;
              local_80._24_8_ = (_Base_ptr)(local_80 + 8);
              p_Stack_60 = (_Base_ptr)(local_80 + 8);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                         *)local_80);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p == &local_50.field_2) {
              return true;
            }
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool LC::initProps() {
        if( !HasProperty("updates") )
            return false;
        if( !HasProperty("cavity") )
            return false;
        if( !HasProperty("tol") )
            return false;
        if( !HasProperty("maxiter") )
            return false;
        if( !HasProperty("verbose") )
            return false;
        
        Props.updates = FromStringTo<UpdateType>("updates");
        Props.cavity  = FromStringTo<CavityType>("cavity");
        if( HasProperty("reinit") )
            Props.reinit = FromStringTo<bool>("reinit");
        else
            Props.reinit = true;
        Props.tol     = FromStringTo<double>("tol");
        Props.maxiter = FromStringTo<size_t>("maxiter");
        Props.verbose = FromStringTo<size_t>("verbose");
        if( HasProperty("damping") )
            Props.damping = FromStringTo<double>("damping");
        else
            Props.damping = 0.0;
        if (HasProperty("cavainame") )
            Props.cavainame = GetPropertyAs<string>("cavainame");
        if (HasProperty("cavaiopts") )
            Props.cavaiopts = FromStringTo<Properties>("cavaiopts");

        return true;
    }